

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<kj::StringTree>::setCapacity(Vector<kj::StringTree> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::StringTree> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x38)) {
    ArrayBuilder<kj::StringTree>::truncate(&this->builder,(char *)newSize,lVar1 % 0x38);
  }
  newBuilder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::StringTree>::addAll<kj::ArrayBuilder<kj::StringTree>>(&newBuilder,&this->builder)
  ;
  ArrayBuilder<kj::StringTree>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::StringTree>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }